

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O0

void sp_solve(int neqns,int *xlnz,double *lnz,int *xnzsub,int *nzsub,double *diag,double *rhs)

{
  double dVar1;
  double dVar2;
  int local_64;
  int local_60;
  int ii_1;
  int jj;
  int j;
  int ii;
  int j_1;
  double s;
  double rhsj;
  int isub;
  int i;
  double *diag_local;
  int *nzsub_local;
  int *xnzsub_local;
  double *lnz_local;
  int *xlnz_local;
  int neqns_local;
  
  for (j = 1; j <= neqns; j = j + 1) {
    dVar1 = rhs[(long)j + -1];
    dVar2 = diag[(long)j + -1];
    rhs[(long)j + -1] = dVar1 / dVar2;
    rhsj._4_4_ = xnzsub[(long)j + -1];
    for (jj = xlnz[(long)j + -1]; jj < xlnz[(long)(j + 1) + -1]; jj = jj + 1) {
      rhs[(long)nzsub[(long)rhsj._4_4_ + -1] + -1] =
           -lnz[(long)jj + -1] * (dVar1 / dVar2) + rhs[(long)nzsub[(long)rhsj._4_4_ + -1] + -1];
      rhsj._4_4_ = rhsj._4_4_ + 1;
    }
  }
  ii_1 = neqns;
  for (local_60 = 1; local_60 <= neqns; local_60 = local_60 + 1) {
    _ii = rhs[(long)ii_1 + -1];
    rhsj._4_4_ = xnzsub[(long)ii_1 + -1];
    for (local_64 = xlnz[(long)ii_1 + -1]; local_64 < xlnz[(long)(ii_1 + 1) + -1];
        local_64 = local_64 + 1) {
      _ii = -lnz[(long)local_64 + -1] * rhs[(long)nzsub[(long)rhsj._4_4_ + -1] + -1] + _ii;
      rhsj._4_4_ = rhsj._4_4_ + 1;
    }
    rhs[(long)ii_1 + -1] = _ii / diag[(long)ii_1 + -1];
    ii_1 = ii_1 + -1;
  }
  return;
}

Assistant:

void sp_solve(int neqns, int* xlnz, double* lnz, int* xnzsub,
           int* nzsub, double* diag, double* rhs)
{
    int i, isub;
    double rhsj, s;

    /* Adjust from C to Fortran */

    --xlnz; --lnz; --xnzsub; --nzsub; --diag; --rhs;

    /* Forward substitution */

    for (int j = 1; j <= neqns; j++)
    {
        rhsj = rhs[j] / diag[j];
        rhs[j] = rhsj;
        i = xnzsub[j];
        for (int ii = xlnz[j]; ii < xlnz[j+1]; ii++)
        {
            isub = nzsub[i];
            rhs[isub] -= lnz[ii] * rhsj;
            i += 1;
        }
    }

    /* Backward substitution */

    int j = neqns;
    for (int jj = 1; jj <= neqns; jj++)
    {
        s = rhs[j];
        i = xnzsub[j];
        for (int ii = xlnz[j]; ii < xlnz[j+1]; ii++)
        {
            isub = nzsub[i];
            s -= lnz[ii] * rhs[isub];
            i += 1;
        }
        rhs[j] = s / diag[j];
        j -= 1;
    }

    /* Adjust from Fortran to C */

    ++xlnz; ++lnz; ++xnzsub; ++nzsub; ++diag; ++rhs;

}